

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

size_t __thiscall BufferWriter::Write(BufferWriter *this,void *buffer,size_t len)

{
  uint uVar1;
  
  uVar1 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->mBuffer,(uint)len);
  memcpy((this->mBuffer).Array + uVar1,buffer,len);
  return len;
}

Assistant:

size_t BufferWriter::Write(const void *buffer, size_t len)
{
	unsigned int ofs = mBuffer.Reserve((unsigned)len);
	memcpy(&mBuffer[ofs], buffer, len);
	return len;
}